

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_RaiseSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *pAVar4;
  AActor *pAVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  char *pcVar8;
  AActor *raiser;
  bool bVar9;
  TThinkerIterator<AActor> it;
  FThinkerIterator local_40;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003da0c4;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003da0b4:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003da0c4:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x121e,
                  "int AF_AActor_A_RaiseSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar7 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar7 == (AActor *)0x0) goto LAB_003d9fac;
    pPVar3 = (pAVar7->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar7->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar9 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar9) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar9 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003da0c4;
    }
  }
  else {
    if (pAVar7 != (AActor *)0x0) goto LAB_003da0b4;
LAB_003d9fac:
    pAVar7 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_003d9fd4:
      iVar2 = param[1].field_0.i;
      FThinkerIterator::FThinkerIterator(&local_40,AActor::RegistrationInfo.MyClass,0x80);
      pAVar4 = (pAVar7->master).field_0.p;
      if (pAVar4 != (AActor *)0x0) {
        if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          pAVar4 = (AActor *)FThinkerIterator::Next(&local_40,false);
          if (pAVar4 != (AActor *)0x0) {
            raiser = pAVar7;
            if (iVar2 == 0) {
              raiser = (AActor *)0x0;
            }
            do {
              pAVar5 = (pAVar7->master).field_0.p;
              if (pAVar5 == (AActor *)0x0) {
LAB_003da04d:
                pAVar5 = (AActor *)0x0;
              }
              else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
                (pAVar7->master).field_0.p = (AActor *)0x0;
                goto LAB_003da04d;
              }
              pAVar6 = (pAVar4->master).field_0.p;
              if (pAVar6 == (AActor *)0x0) {
LAB_003da06c:
                pAVar6 = (AActor *)0x0;
              }
              else if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
                (pAVar4->master).field_0.p = (AActor *)0x0;
                goto LAB_003da06c;
              }
              if (pAVar4 != pAVar7 && pAVar6 == pAVar5) {
                P_Thing_Raise(pAVar4,raiser);
              }
              pAVar4 = (AActor *)FThinkerIterator::Next(&local_40,false);
            } while (pAVar4 != (AActor *)0x0);
          }
        }
        else {
          (pAVar7->master).field_0.p = (AActor *)0x0;
        }
      }
      return 0;
    }
    pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_003d9fd4;
    pcVar8 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x121f,
                "int AF_AActor_A_RaiseSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RaiseSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(copy);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ((mo = it.Next()) != NULL)
		{
			if (mo->master == self->master && mo != self)
			{
				P_Thing_Raise(mo, copy ? self : NULL);
			}
		}
	}
	return 0;
}